

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::update(raw_quasi_adaptive_huffman_data_model *this)

{
  long lVar1;
  raw_quasi_adaptive_huffman_data_model *this_00;
  vector<unsigned_char> *pvVar2;
  vector<unsigned_short> *this_01;
  undefined8 uStackY_a0;
  undefined1 auStackY_98 [8];
  uint local_90;
  uint local_8c;
  uchar *local_88;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 uStack_70;
  unsigned_short *local_68 [2];
  uint local_54;
  undefined8 local_50;
  undefined8 uStack_48;
  raw_quasi_adaptive_huffman_data_model *local_40;
  undefined1 local_32;
  bool local_31;
  uint local_30;
  bool status_1;
  uint uStack_2c;
  bool status;
  uint total_freq;
  uint max_code_size;
  void *pTables;
  raw_quasi_adaptive_huffman_data_model *prStack_18;
  uint table_size;
  raw_quasi_adaptive_huffman_data_model *this_local;
  
  this->m_total_count = this->m_update_cycle + this->m_total_count;
  local_40 = this;
  prStack_18 = this;
  while (0x7fff < local_40->m_total_count) {
    uStackY_a0 = 0x1366f6;
    rescale((raw_quasi_adaptive_huffman_data_model *)
            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  if ((local_40->m_use_polar_codes & 1U) == 0) {
    uStackY_a0 = 0x136711;
    uStack_48._4_4_ = get_generate_huffman_codes_table_size();
  }
  else {
    uStackY_a0 = 0x136707;
    uStack_48._4_4_ = get_generate_polar_codes_table_size();
  }
  this_00 = local_40;
  pTables._4_4_ = uStack_48._4_4_;
  lVar1 = -((ulong)uStack_48._4_4_ + 0xf & 0xfffffffffffffff0);
  _total_freq = auStackY_98 + lVar1;
  if ((local_40->m_use_polar_codes & 1U) == 0) {
    uStack_70._4_4_ = local_40->m_total_syms;
    *(undefined8 *)(auStackY_98 + lVar1 + -8) = 0x1367a5;
    local_68[0] = vector<unsigned_short>::operator[](&this_00->m_sym_freq,0);
    pvVar2 = &local_40->m_code_sizes;
    *(undefined8 *)(auStackY_98 + lVar1 + -8) = 0x1367b8;
    vector<unsigned_char>::operator[](pvVar2,0);
    *(undefined8 *)(auStackY_98 + lVar1 + -8) = 0x1367d3;
    local_31 = generate_huffman_codes
                         (*(void **)(&stack0x00000928 + lVar1),*(uint *)(&stack0x00000924 + lVar1),
                          *(uint16 **)(&stack0x00000918 + lVar1),
                          *(uint8 **)(&stack0x00000910 + lVar1),*(uint **)(&stack0x00000908 + lVar1)
                          ,*(uint **)(&stack0x00000900 + lVar1));
  }
  else {
    local_54 = local_40->m_total_syms;
    local_68[1] = (unsigned_short *)_total_freq;
    *(undefined8 *)(auStackY_98 + lVar1 + -8) = 0x136757;
    local_50 = vector<unsigned_short>::operator[](&this_00->m_sym_freq,0);
    pvVar2 = &local_40->m_code_sizes;
    *(undefined8 *)(auStackY_98 + lVar1 + -8) = 0x13676a;
    vector<unsigned_char>::operator[](pvVar2,0);
    *(undefined8 *)(auStackY_98 + lVar1 + -8) = 0x136785;
    local_31 = generate_polar_codes
                         (*(void **)((long)&uStack_48 + lVar1),
                          *(uint *)((long)&local_50 + lVar1 + 4),
                          *(uint16 **)(&stack0xffffffffffffffa8 + lVar1),
                          *(uint8 **)((long)local_68 + lVar1 + 8),*(uint **)((long)local_68 + lVar1)
                          ,*(uint **)((long)&uStack_70 + lVar1));
  }
  if ((local_31 == false) || (local_30 != local_40->m_total_count)) {
    this_local._7_1_ = false;
  }
  else {
    if (0x10 < uStack_2c) {
      pvVar2 = &local_40->m_code_sizes;
      *(undefined8 *)(auStackY_98 + lVar1 + -8) = 0x13680e;
      vector<unsigned_char>::operator[](pvVar2,0);
      *(undefined8 *)(auStackY_98 + lVar1 + -8) = 0x13681e;
      local_32 = prefix_coding::limit_max_code_size
                           (*(uint *)(&stack0x000004e0 + lVar1),
                            *(uint8 **)(&stack0x000004d8 + lVar1),
                            *(uint *)(&stack0x000004d4 + lVar1));
      if (!(bool)local_32) {
        return false;
      }
    }
    if ((local_40->m_encoding & 1U) == 0) {
      local_90 = local_40->m_total_syms;
      pvVar2 = &local_40->m_code_sizes;
      *(undefined8 *)(auStackY_98 + lVar1 + -8) = 0x13689a;
      vector<unsigned_char>::operator[](pvVar2,0);
      *(undefined8 *)(auStackY_98 + lVar1 + -8) = 0x1368b4;
      local_31 = prefix_coding::generate_decoder_tables
                           (*(uint *)(&stack0x000000c0 + lVar1),
                            *(uint8 **)(&stack0x000000b8 + lVar1),
                            *(decoder_tables **)(&stack0x000000b0 + lVar1),
                            *(uint *)(&stack0x000000ac + lVar1));
    }
    else {
      local_8c = local_40->m_total_syms;
      pvVar2 = &local_40->m_code_sizes;
      *(undefined8 *)(auStackY_98 + lVar1 + -8) = 0x136856;
      local_88 = vector<unsigned_char>::operator[](pvVar2,0);
      this_01 = &local_40->m_codes;
      *(undefined8 *)(auStackY_98 + lVar1 + -8) = 0x136869;
      vector<unsigned_short>::operator[](this_01,0);
      *(undefined8 *)(auStackY_98 + lVar1 + -8) = 0x13687b;
      local_31 = prefix_coding::generate_codes
                           (*(uint *)(&stack0x00000030 + lVar1),
                            *(uint8 **)(&stack0x00000028 + lVar1),
                            *(uint16 **)(&stack0x00000020 + lVar1));
    }
    if (local_31 == false) {
      this_local._7_1_ = false;
    }
    else {
      if ((local_40->m_fast_updating & 1U) == 0) {
        local_40->m_update_cycle = local_40->m_update_cycle * 5 >> 2;
      }
      else {
        local_40->m_update_cycle = local_40->m_update_cycle << 1;
      }
      if (local_40->m_max_cycle < local_40->m_update_cycle) {
        local_40->m_update_cycle = local_40->m_max_cycle;
      }
      local_40->m_symbols_until_update = local_40->m_update_cycle;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool raw_quasi_adaptive_huffman_data_model::update()
   {
      LZHAM_ASSERT(!m_symbols_until_update);
      m_total_count += m_update_cycle;
      LZHAM_ASSERT(m_total_count <= 65535);

      while (m_total_count >= 32768)
         rescale();

      uint table_size = m_use_polar_codes ? get_generate_polar_codes_table_size() : get_generate_huffman_codes_table_size();
      void *pTables = alloca(table_size);

      uint max_code_size, total_freq;
      bool status;
      if (m_use_polar_codes)
         status = generate_polar_codes(pTables, m_total_syms, &m_sym_freq[0], &m_code_sizes[0], max_code_size, total_freq);
      else
         status = generate_huffman_codes(pTables, m_total_syms, &m_sym_freq[0], &m_code_sizes[0], max_code_size, total_freq);
      LZHAM_ASSERT(status);
      LZHAM_ASSERT(total_freq == m_total_count);
      if ((!status) || (total_freq != m_total_count))
         return false;

      if (max_code_size > prefix_coding::cMaxExpectedCodeSize)
      {
         bool status = prefix_coding::limit_max_code_size(m_total_syms, &m_code_sizes[0], prefix_coding::cMaxExpectedCodeSize);
         LZHAM_ASSERT(status);
         if (!status)
            return false;
      }

      if (m_encoding)
         status = prefix_coding::generate_codes(m_total_syms, &m_code_sizes[0], &m_codes[0]);
      else
         status = prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, m_decoder_table_bits);

      LZHAM_ASSERT(status);
      if (!status)
         return false;

      if (m_fast_updating)
         m_update_cycle = 2 * m_update_cycle;
      else
         m_update_cycle = (5 * m_update_cycle) >> 2;

      if (m_update_cycle > m_max_cycle)
         m_update_cycle = m_max_cycle;

      m_symbols_until_update = m_update_cycle;

      return true;
   }